

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<anurbs::Polygon> * __thiscall
pybind11::class_<anurbs::Polygon>::
def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::Polygon::*)(long,long)const,pybind11::arg,pybind11::arg>
          (class_<anurbs::Polygon> *this,char *name_,offset_in_Model_to_subr *f,arg *extra,
          arg *extra_1)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  handle obj;
  undefined1 key [8];
  undefined1 local_78 [8];
  cpp_function cf;
  handle local_68;
  object local_60;
  handle local_58;
  is_method local_50;
  PyObject *local_48;
  object local_40;
  object local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_58.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50.class_.m_ptr = (handle)(handle)name_;
  local_68.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_68.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_78 = (undefined1  [8])local_68.m_ptr;
  cpp_function::
  cpp_function<Eigen::Matrix<double,1,2,1,1,2>,anurbs::Polygon,long,long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&cf,f_00,extra_00,&local_50,(sibling *)&local_58,(arg *)local_78,extra);
  object::~object((object *)&local_68);
  object::~object(&local_60);
  cpp_function::name((cpp_function *)local_78);
  key = local_78;
  obj.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  if (local_78 != (undefined1  [8])0x0) {
    *(Py_ssize_t *)local_78 = *(Py_ssize_t *)local_78 + 1;
  }
  local_40.super_handle.m_ptr = (handle)(handle)local_78;
  local_58.m_ptr = (PyObject *)0x0;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_48 = obj.m_ptr;
  object::~object((object *)&local_58);
  detail::accessor_policies::obj_attr::set
            (obj,(handle)key,(handle)cf.super_function.super_object.super_handle.m_ptr);
  object::~object(&local_38);
  object::~object(&local_40);
  object::~object((object *)local_78);
  object::~object((object *)&cf);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }